

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

block_state deflate_stored(deflate_state *s,int flush)

{
  uInt uVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_4c;
  uint local_48;
  uint local_40;
  uint local_30;
  uint used;
  uint last;
  uint have;
  uint left;
  uint len;
  uint min_block;
  int flush_local;
  deflate_state *s_local;
  
  if ((ulong)s->w_size < s->pending_buf_size - 5) {
    local_40 = s->w_size;
  }
  else {
    local_40 = (int)s->pending_buf_size - 5;
  }
  local_30 = 0;
  uVar1 = s->strm->avail_in;
  while( true ) {
    have = 0xffff;
    uVar3 = s->bi_valid + 0x2a >> 3;
    if (s->strm->avail_out < uVar3) break;
    uVar3 = s->strm->avail_out - uVar3;
    last = s->strstart - (int)s->block_start;
    if ((ulong)last + (ulong)s->strm->avail_in < 0xffff) {
      have = last + s->strm->avail_in;
    }
    if (uVar3 < have) {
      have = uVar3;
    }
    if ((have < local_40) &&
       ((((have == 0 && (flush != 4)) || (flush == 0)) || (have != last + s->strm->avail_in))))
    break;
    bVar4 = false;
    if (flush == 4) {
      bVar4 = have == last + s->strm->avail_in;
    }
    local_30 = (uint)bVar4;
    _tr_stored_block(s,(charf *)0x0,0,local_30);
    s->pending_buf[s->pending - 4] = (byte)have;
    bVar2 = (byte)(have >> 8);
    s->pending_buf[s->pending - 3] = bVar2;
    s->pending_buf[s->pending - 2] = (byte)have ^ 0xff;
    s->pending_buf[s->pending - 1] = bVar2 ^ 0xff;
    flush_pending(s->strm);
    if (last != 0) {
      if (have < last) {
        last = have;
      }
      memcpy(s->strm->next_out,s->window + s->block_start,(ulong)last);
      s->strm->next_out = s->strm->next_out + last;
      s->strm->avail_out = s->strm->avail_out - last;
      s->strm->total_out = (ulong)last + s->strm->total_out;
      s->block_start = (ulong)last + s->block_start;
      have = have - last;
    }
    if (have != 0) {
      read_buf(s->strm,s->strm->next_out,have);
      s->strm->next_out = s->strm->next_out + have;
      s->strm->avail_out = s->strm->avail_out - have;
      s->strm->total_out = (ulong)have + s->strm->total_out;
    }
    if (local_30 != 0) break;
  }
  local_48 = uVar1 - s->strm->avail_in;
  if (local_48 != 0) {
    if (local_48 < s->w_size) {
      if (s->window_size - (ulong)s->strstart <= (ulong)local_48) {
        s->strstart = s->strstart - s->w_size;
        memcpy(s->window,s->window + s->w_size,(ulong)s->strstart);
        if (s->matches < 2) {
          s->matches = s->matches + 1;
        }
        if (s->strstart < s->insert) {
          s->insert = s->strstart;
        }
      }
      memcpy(s->window + s->strstart,s->strm->next_in + -(ulong)local_48,(ulong)local_48);
      s->strstart = local_48 + s->strstart;
      if (s->w_size - s->insert < local_48) {
        local_48 = s->w_size - s->insert;
      }
      s->insert = local_48 + s->insert;
    }
    else {
      s->matches = 2;
      memcpy(s->window,s->strm->next_in + -(ulong)s->w_size,(ulong)s->w_size);
      s->strstart = s->w_size;
      s->insert = s->strstart;
    }
    s->block_start = (ulong)s->strstart;
  }
  if (s->high_water < (ulong)s->strstart) {
    s->high_water = (ulong)s->strstart;
  }
  if (local_30 == 0) {
    if (((flush == 0) || (flush == 4)) ||
       ((s->strm->avail_in != 0 || ((ulong)s->strstart != s->block_start)))) {
      used = (int)s->window_size - s->strstart;
      if ((used < s->strm->avail_in) && ((long)(ulong)s->w_size <= s->block_start)) {
        s->block_start = s->block_start - (ulong)s->w_size;
        s->strstart = s->strstart - s->w_size;
        memcpy(s->window,s->window + s->w_size,(ulong)s->strstart);
        if (s->matches < 2) {
          s->matches = s->matches + 1;
        }
        used = s->w_size + used;
        if (s->strstart < s->insert) {
          s->insert = s->strstart;
        }
      }
      if (s->strm->avail_in < used) {
        used = s->strm->avail_in;
      }
      if (used != 0) {
        read_buf(s->strm,s->window + s->strstart,used);
        s->strstart = used + s->strstart;
        if (s->w_size - s->insert < used) {
          local_4c = s->w_size - s->insert;
        }
        else {
          local_4c = used;
        }
        s->insert = local_4c + s->insert;
      }
      if (s->high_water < (ulong)s->strstart) {
        s->high_water = (ulong)s->strstart;
      }
      local_58 = s->bi_valid + 0x2a >> 3;
      if (s->pending_buf_size - (ulong)local_58 < 0x10000) {
        local_58 = (int)s->pending_buf_size - local_58;
      }
      else {
        local_58 = 0xffff;
      }
      local_5c = local_58;
      if (s->w_size < local_58) {
        local_5c = s->w_size;
      }
      uVar3 = s->strstart - (int)s->block_start;
      if ((local_5c <= uVar3) ||
         ((((uVar3 != 0 || (flush == 4)) && (flush != 0)) &&
          ((s->strm->avail_in == 0 && (uVar3 <= local_58)))))) {
        local_60 = uVar3;
        if (local_58 < uVar3) {
          local_60 = local_58;
        }
        bVar4 = false;
        if ((flush == 4) && (bVar4 = false, s->strm->avail_in == 0)) {
          bVar4 = local_60 == uVar3;
        }
        local_30 = (uint)bVar4;
        _tr_stored_block(s,(charf *)(s->window + s->block_start),(ulong)local_60,local_30);
        s->block_start = (ulong)local_60 + s->block_start;
        flush_pending(s->strm);
      }
      s_local._4_4_ = need_more;
      if (local_30 != 0) {
        s_local._4_4_ = finish_started;
      }
    }
    else {
      s_local._4_4_ = block_done;
    }
  }
  else {
    s_local._4_4_ = finish_done;
  }
  return s_local._4_4_;
}

Assistant:

local block_state deflate_stored(deflate_state *s, int flush) {
    /* Smallest worthy block size when not flushing or finishing. By default
     * this is 32K. This can be as small as 507 bytes for memLevel == 1. For
     * large input and output buffers, the stored block size will be larger.
     */
    unsigned min_block = MIN(s->pending_buf_size - 5, s->w_size);

    /* Copy as many min_block or larger stored blocks directly to next_out as
     * possible. If flushing, copy the remaining available input to next_out as
     * stored blocks, if there is enough space.
     */
    unsigned len, left, have, last = 0;
    unsigned used = s->strm->avail_in;
    do {
        /* Set len to the maximum size block that we can copy directly with the
         * available input data and output space. Set left to how much of that
         * would be copied from what's left in the window.
         */
        len = MAX_STORED;       /* maximum deflate stored block length */
        have = (s->bi_valid + 42) >> 3;         /* number of header bytes */
        if (s->strm->avail_out < have)          /* need room for header */
            break;
            /* maximum stored block length that will fit in avail_out: */
        have = s->strm->avail_out - have;
        left = s->strstart - s->block_start;    /* bytes left in window */
        if (len > (ulg)left + s->strm->avail_in)
            len = left + s->strm->avail_in;     /* limit len to the input */
        if (len > have)
            len = have;                         /* limit len to the output */

        /* If the stored block would be less than min_block in length, or if
         * unable to copy all of the available input when flushing, then try
         * copying to the window and the pending buffer instead. Also don't
         * write an empty block when flushing -- deflate() does that.
         */
        if (len < min_block && ((len == 0 && flush != Z_FINISH) ||
                                flush == Z_NO_FLUSH ||
                                len != left + s->strm->avail_in))
            break;

        /* Make a dummy stored block in pending to get the header bytes,
         * including any pending bits. This also updates the debugging counts.
         */
        last = flush == Z_FINISH && len == left + s->strm->avail_in ? 1 : 0;
        _tr_stored_block(s, (char *)0, 0L, last);

        /* Replace the lengths in the dummy stored block with len. */
        s->pending_buf[s->pending - 4] = len;
        s->pending_buf[s->pending - 3] = len >> 8;
        s->pending_buf[s->pending - 2] = ~len;
        s->pending_buf[s->pending - 1] = ~len >> 8;

        /* Write the stored block header bytes. */
        flush_pending(s->strm);

#ifdef ZLIB_DEBUG
        /* Update debugging counts for the data about to be copied. */
        s->compressed_len += len << 3;
        s->bits_sent += len << 3;
#endif

        /* Copy uncompressed bytes from the window to next_out. */
        if (left) {
            if (left > len)
                left = len;
            zmemcpy(s->strm->next_out, s->window + s->block_start, left);
            s->strm->next_out += left;
            s->strm->avail_out -= left;
            s->strm->total_out += left;
            s->block_start += left;
            len -= left;
        }

        /* Copy uncompressed bytes directly from next_in to next_out, updating
         * the check value.
         */
        if (len) {
            read_buf(s->strm, s->strm->next_out, len);
            s->strm->next_out += len;
            s->strm->avail_out -= len;
            s->strm->total_out += len;
        }
    } while (last == 0);

    /* Update the sliding window with the last s->w_size bytes of the copied
     * data, or append all of the copied data to the existing window if less
     * than s->w_size bytes were copied. Also update the number of bytes to
     * insert in the hash tables, in the event that deflateParams() switches to
     * a non-zero compression level.
     */
    used -= s->strm->avail_in;      /* number of input bytes directly copied */
    if (used) {
        /* If any input was used, then no unused input remains in the window,
         * therefore s->block_start == s->strstart.
         */
        if (used >= s->w_size) {    /* supplant the previous history */
            s->matches = 2;         /* clear hash */
            zmemcpy(s->window, s->strm->next_in - s->w_size, s->w_size);
            s->strstart = s->w_size;
            s->insert = s->strstart;
        }
        else {
            if (s->window_size - s->strstart <= used) {
                /* Slide the window down. */
                s->strstart -= s->w_size;
                zmemcpy(s->window, s->window + s->w_size, s->strstart);
                if (s->matches < 2)
                    s->matches++;   /* add a pending slide_hash() */
                if (s->insert > s->strstart)
                    s->insert = s->strstart;
            }
            zmemcpy(s->window + s->strstart, s->strm->next_in - used, used);
            s->strstart += used;
            s->insert += MIN(used, s->w_size - s->insert);
        }
        s->block_start = s->strstart;
    }
    if (s->high_water < s->strstart)
        s->high_water = s->strstart;

    /* If the last block was written to next_out, then done. */
    if (last)
        return finish_done;

    /* If flushing and all input has been consumed, then done. */
    if (flush != Z_NO_FLUSH && flush != Z_FINISH &&
        s->strm->avail_in == 0 && (long)s->strstart == s->block_start)
        return block_done;

    /* Fill the window with any remaining input. */
    have = s->window_size - s->strstart;
    if (s->strm->avail_in > have && s->block_start >= (long)s->w_size) {
        /* Slide the window down. */
        s->block_start -= s->w_size;
        s->strstart -= s->w_size;
        zmemcpy(s->window, s->window + s->w_size, s->strstart);
        if (s->matches < 2)
            s->matches++;           /* add a pending slide_hash() */
        have += s->w_size;          /* more space now */
        if (s->insert > s->strstart)
            s->insert = s->strstart;
    }
    if (have > s->strm->avail_in)
        have = s->strm->avail_in;
    if (have) {
        read_buf(s->strm, s->window + s->strstart, have);
        s->strstart += have;
        s->insert += MIN(have, s->w_size - s->insert);
    }
    if (s->high_water < s->strstart)
        s->high_water = s->strstart;

    /* There was not enough avail_out to write a complete worthy or flushed
     * stored block to next_out. Write a stored block to pending instead, if we
     * have enough input for a worthy block, or if flushing and there is enough
     * room for the remaining input as a stored block in the pending buffer.
     */
    have = (s->bi_valid + 42) >> 3;         /* number of header bytes */
        /* maximum stored block length that will fit in pending: */
    have = MIN(s->pending_buf_size - have, MAX_STORED);
    min_block = MIN(have, s->w_size);
    left = s->strstart - s->block_start;
    if (left >= min_block ||
        ((left || flush == Z_FINISH) && flush != Z_NO_FLUSH &&
         s->strm->avail_in == 0 && left <= have)) {
        len = MIN(left, have);
        last = flush == Z_FINISH && s->strm->avail_in == 0 &&
               len == left ? 1 : 0;
        _tr_stored_block(s, (charf *)s->window + s->block_start, len, last);
        s->block_start += len;
        flush_pending(s->strm);
    }

    /* We've done all we can with the available input and output. */
    return last ? finish_started : need_more;
}